

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData * cfd::core::CreatePsbtOutputOnlyData(ByteData *__return_storage_ptr__,wally_psbt *psbt)

{
  wally_psbt_output *pwVar1;
  wally_map_item *pwVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  size_t i_1;
  ulong uVar5;
  allocator_type local_a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Serializer builder;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tx;
  
  Serializer::Serializer(&builder);
  Serializer::AddDirectBytes(&builder,psbt->magic,5);
  Serializer::AddDirectByte(&builder,'\x01');
  Serializer::AddVariableInt(&builder,0);
  ConvertBitcoinTxFromWally((ByteData *)&data,psbt->tx,false);
  ByteData::GetBytes(&tx,(ByteData *)&data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Serializer::AddVariableBuffer
            (&builder,tx.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (int)tx.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
             (int)tx.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  if (psbt->version != 0) {
    Serializer::AddDirectByte(&builder,'\x01');
    Serializer::AddVariableInt(&builder,0xfb);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,4,&local_a1);
    memcpy(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,&psbt->version,
           (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    Serializer::AddVariableBuffer
              (&builder,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,4);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  lVar3 = 0x18;
  for (uVar4 = 0; uVar4 < (psbt->unknowns).num_items; uVar4 = uVar4 + 1) {
    pwVar2 = (psbt->unknowns).items;
    Serializer::AddVariableBuffer
              (&builder,*(uint8_t **)((long)pwVar2 + lVar3 + -0x18),
               *(uint32_t *)((long)pwVar2 + lVar3 + -0x10));
    Serializer::AddVariableBuffer
              (&builder,*(uint8_t **)((long)pwVar2 + lVar3 + -8),
               *(uint32_t *)((long)&pwVar2->key + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  Serializer::AddDirectByte(&builder,'\0');
  for (uVar4 = 0; uVar4 < psbt->num_outputs; uVar4 = uVar4 + 1) {
    pwVar1 = psbt->outputs + uVar4;
    if (psbt->outputs[uVar4].redeem_script_len != 0) {
      Serializer::AddDirectByte(&builder,'\x01');
      Serializer::AddVariableInt(&builder,0);
      Serializer::AddVariableBuffer
                (&builder,pwVar1->redeem_script,(uint32_t)pwVar1->redeem_script_len);
    }
    if (pwVar1->witness_script_len != 0) {
      Serializer::AddDirectByte(&builder,'\x01');
      Serializer::AddVariableInt(&builder,1);
      Serializer::AddVariableBuffer
                (&builder,pwVar1->witness_script,(uint32_t)pwVar1->witness_script_len);
    }
    lVar3 = 0x18;
    for (uVar5 = 0; uVar5 < (pwVar1->keypaths).num_items; uVar5 = uVar5 + 1) {
      pwVar2 = (pwVar1->keypaths).items;
      Serializer::AddPrefixBuffer
                (&builder,2,*(uint8_t **)((long)pwVar2 + lVar3 + -0x18),
                 *(uint32_t *)((long)pwVar2 + lVar3 + -0x10));
      Serializer::AddVariableBuffer
                (&builder,*(uint8_t **)((long)pwVar2 + lVar3 + -8),
                 *(uint32_t *)((long)&pwVar2->key + lVar3));
      lVar3 = lVar3 + 0x20;
    }
    lVar3 = 0x18;
    for (uVar5 = 0; uVar5 < (pwVar1->unknowns).num_items; uVar5 = uVar5 + 1) {
      pwVar2 = (pwVar1->unknowns).items;
      Serializer::AddVariableBuffer
                (&builder,*(uint8_t **)((long)pwVar2 + lVar3 + -0x18),
                 *(uint32_t *)((long)pwVar2 + lVar3 + -0x10));
      Serializer::AddVariableBuffer
                (&builder,*(uint8_t **)((long)pwVar2 + lVar3 + -8),
                 *(uint32_t *)((long)&pwVar2->key + lVar3));
      lVar3 = lVar3 + 0x20;
    }
    Serializer::AddDirectByte(&builder,'\0');
  }
  Serializer::Output(__return_storage_ptr__,&builder);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tx.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Serializer::~Serializer(&builder);
  return __return_storage_ptr__;
}

Assistant:

ByteData CreatePsbtOutputOnlyData(const struct wally_psbt *psbt) {
  Serializer builder;
  builder.AddDirectBytes(psbt->magic, sizeof(psbt->magic));

  builder.AddDirectByte(1);
  builder.AddVariableInt(Psbt::kPsbtGlobalUnsignedTx);
  auto tx = ConvertBitcoinTxFromWally(psbt->tx, false).GetBytes();
  builder.AddVariableBuffer(tx.data(), static_cast<uint32_t>(tx.size()));

  if (psbt->version > 0) {
    builder.AddDirectByte(1);
    builder.AddVariableInt(Psbt::kPsbtGlobalVersion);
    std::vector<uint8_t> data(sizeof(psbt->version));
    memcpy(data.data(), &psbt->version, data.size());
    // TODO(k-matsuzawa) need endian support.
    builder.AddVariableBuffer(data.data(), sizeof(psbt->version));
  }

  for (size_t i = 0; i < psbt->unknowns.num_items; ++i) {
    auto *item = &psbt->unknowns.items[i];
    builder.AddVariableBuffer(item->key, static_cast<uint32_t>(item->key_len));
    builder.AddVariableBuffer(
        item->value, static_cast<uint32_t>(item->value_len));
  }
  builder.AddDirectByte(kPsbtSeparator);

  // input is unsupport.

  for (size_t i = 0; i < psbt->num_outputs; ++i) {
    WritePsbtOutput(&builder, &psbt->outputs[i]);
  }
  return builder.Output();
}